

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_token_timesamples<tinyusdz::DomeLight::TextureFormat>
                   (string *__return_storage_ptr__,
                   TypedTimeSamples<tinyusdz::DomeLight::TextureFormat> *v,uint32_t indent)

{
  pointer pSVar1;
  string *psVar2;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample>_>
  *pvVar3;
  ostream *poVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  TextureFormat *texformat;
  undefined8 extraout_RDX_00;
  long lVar6;
  uint uVar7;
  size_t i;
  ulong uVar8;
  allocator local_22d;
  uint local_22c;
  pprint *local_228;
  string *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  local_220 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  ::std::operator<<(local_1a8,"{\n");
  pvVar3 = TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::get_samples(v);
  uVar7 = indent + 1;
  lVar6 = 8;
  uVar5 = extraout_RDX;
  local_22c = uVar7;
  local_228 = (pprint *)(ulong)indent;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(pvVar3->
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar3->
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar8 = uVar8 + 1) {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)(ulong)uVar7,(uint32_t)uVar5);
    ::std::operator<<(local_1a8,(string *)&local_1f8);
    poVar4 = ::std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(pvVar3->
                                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar6 + -8));
    ::std::operator<<(poVar4,": ");
    ::std::__cxx11::string::_M_dispose();
    pSVar1 = (pvVar3->
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::DomeLight::TextureFormat>::Sample>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*(char *)((long)&pSVar1->t + lVar6 + 4) == '\x01') {
      ::std::operator<<(local_1a8,"None");
    }
    else {
      to_string_abi_cxx11_(&local_218,(tinyusdz *)((long)&pSVar1->t + lVar6),texformat);
      ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_22d);
      quote(&local_1f8,&local_218,&local_1d8);
      ::std::operator<<(local_1a8,(string *)&local_1f8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      uVar7 = local_22c;
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,",\n");
    lVar6 = lVar6 + 0x10;
    uVar5 = extraout_RDX_00;
  }
  pprint::Indent_abi_cxx11_(&local_1f8,local_228,(uint32_t)uVar5);
  poVar4 = ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::operator<<(poVar4,"}\n");
  ::std::__cxx11::string::_M_dispose();
  psVar2 = local_220;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return psVar2;
}

Assistant:

std::string print_typed_token_timesamples(const TypedTimeSamples<T> &v,
                                          const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << quote(to_string(samples[i].value));
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}